

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O1

void printUnsignedImm(MCInst *MI,int opNum,SStream *O)

{
  anon_union_1480_8_3a70395c_for_cs_detail_6 *paVar1;
  uint8_t *puVar2;
  cs_detail *pcVar3;
  _Bool _Var4;
  MCOperand *op;
  ulong uVar5;
  ulong uVar6;
  char *fmt;
  
  op = MCInst_getOperand(MI,opNum);
  _Var4 = MCOperand_isImm(op);
  if (_Var4) {
    uVar5 = MCOperand_getImm(op);
    if ((long)uVar5 < 0) {
      if ((long)uVar5 < -9) {
        uVar6 = (ulong)(uint)(int)(short)-(int)uVar5;
        fmt = "-0x%x";
      }
      else {
        uVar6 = (ulong)(-(int)uVar5 & 0xffff);
        fmt = "-%u";
      }
    }
    else {
      uVar6 = uVar5 & 0xffff;
      if ((long)uVar5 < 10) {
        fmt = "%u";
      }
      else {
        fmt = "0x%x";
      }
    }
    SStream_concat(O,fmt,uVar6);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar3 = MI->flat_insn->detail;
      puVar2 = pcVar3->groups + (ulong)(pcVar3->field_6).x86.prefix[0] * 0x18 + 0x16;
      puVar2[0] = '\x02';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      pcVar3 = MI->flat_insn->detail;
      *(ulong *)(pcVar3->groups + (ulong)(pcVar3->field_6).x86.prefix[0] * 0x18 + 0x1e) =
           uVar5 & 0xffff;
      paVar1 = &MI->flat_insn->detail->field_6;
      (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
    }
    return;
  }
  printOperand(MI,opNum,O);
  return;
}

Assistant:

static void printUnsignedImm(MCInst *MI, int opNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, opNum);
	if (MCOperand_isImm(MO)) {
		int64_t imm = MCOperand_getImm(MO);
		if (imm >= 0) {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%x", (unsigned short int)imm);
			else
				SStream_concat(O, "%u", (unsigned short int)imm);
		} else {
			if (imm < -HEX_THRESHOLD)
				SStream_concat(O, "-0x%x", (short int)-imm);
			else
				SStream_concat(O, "-%u", (short int)-imm);
		}
		if (MI->csh->detail) {
			MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].type = MIPS_OP_IMM;
			MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].imm = (unsigned short int)imm;
			MI->flat_insn->detail->mips.op_count++;
		}
	} else
		printOperand(MI, opNum, O);
}